

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O1

sample_type __thiscall
charls::
jls_codec<charls::default_traits<unsigned_char,_charls::quad<unsigned_char>_>,_charls::decoder_strategy>
::do_regular(jls_codec<charls::default_traits<unsigned_char,_charls::quad<unsigned_char>_>,_charls::decoder_strategy>
             *this,int32_t qs,int32_t param_2,int32_t predicted,decoder_strategy *param_4)

{
  uint uVar1;
  int32_t length;
  uchar uVar2;
  int iVar3;
  int32_t k;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  context_regular_mode *this_00;
  ulong uVar8;
  
  iVar3 = -qs;
  if (0 < qs) {
    iVar3 = qs;
  }
  this_00 = (this->contexts_)._M_elems + iVar3;
  k = context_regular_mode::get_golomb_coding_parameter(this_00);
  uVar7 = (this->contexts_)._M_elems[iVar3].c_;
  uVar1 = (this->traits_).maximum_sample_value;
  if ((this->super_decoder_strategy).valid_bits_ < 8) {
    decoder_strategy::fill_read_cache(&this->super_decoder_strategy);
  }
  uVar8 = (this->super_decoder_strategy).read_cache_ >> 0x38;
  length = *(int32_t *)((long)k * 0x800 + 0x14a2d4 + uVar8 * 8);
  if (length == 0) {
    uVar6 = decode_value(this,k,(this->traits_).limit,(this->traits_).quantized_bits_per_pixel);
    uVar6 = (int)uVar6 >> 1 ^ -(uVar6 & 1);
    uVar4 = -uVar6;
    if (0 < (int)uVar6) {
      uVar4 = uVar6;
    }
    if (0xffff < uVar4) {
      jls_codec<charls::default_traits<unsigned_char,charls::quad<unsigned_char>>,charls::decoder_strategy>
      ::do_regular();
    }
  }
  else {
    decoder_strategy::skip(&this->super_decoder_strategy,length);
    uVar6 = *(uint *)(decoding_tables + uVar8 * 8 + (long)k * 0x800);
    uVar4 = -uVar6;
    if (0 < (int)uVar6) {
      uVar4 = uVar6;
    }
    if (0xfffe < uVar4) {
      __assert_fail("std::abs(error_value) < 65535",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cornerstonejs[P]charls/src/scan.h"
                    ,0x13f,
                    "sample_type charls::jls_codec<charls::default_traits<unsigned char, charls::quad<unsigned char>>, charls::decoder_strategy>::do_regular(const int32_t, int32_t, const int32_t, decoder_strategy *) [Traits = charls::default_traits<unsigned char, charls::quad<unsigned char>>, Strategy = charls::decoder_strategy]"
                   );
    }
  }
  uVar4 = qs >> 0x1f;
  if (k == 0) {
    uVar5 = 0;
    if ((this->traits_).near_lossless == 0) {
      uVar5 = (this->contexts_)._M_elems[iVar3].n_ + (this->contexts_)._M_elems[iVar3].b_ * 2 + -1
              >> 0x1f;
    }
    uVar6 = uVar6 ^ uVar5;
  }
  uVar5 = ((uVar7 ^ uVar4) - uVar4) + predicted;
  uVar7 = 0;
  if (-1 < (int)uVar5) {
    uVar7 = uVar1;
  }
  if ((uVar5 & ~uVar1) == 0) {
    uVar7 = uVar5;
  }
  context_regular_mode::update_variables_and_bias
            (this_00,uVar6,(this->traits_).near_lossless,(this->traits_).reset_threshold);
  uVar2 = default_traits<unsigned_char,_charls::quad<unsigned_char>_>::fix_reconstructed_value
                    (&this->traits_,
                     ((this->traits_).near_lossless * 2 + 1) * ((uVar6 ^ uVar4) - uVar4) + uVar7);
  return uVar2;
}

Assistant:

do_regular(const int32_t qs, int32_t /*x*/, const int32_t predicted,
                                        decoder_strategy* /*template_selector*/)
    {
        const int32_t sign{bit_wise_sign(qs)};
        context_regular_mode& context{contexts_[apply_sign(qs, sign)]};
        const int32_t k{context.get_golomb_coding_parameter()};
        const int32_t predicted_value{traits_.correct_prediction(predicted + apply_sign(context.c(), sign))};

        int32_t error_value;
        const golomb_code& code = decoding_tables[k].get(Strategy::peek_byte());
        if (code.length() != 0)
        {
            Strategy::skip(code.length());
            error_value = code.value();
            ASSERT(std::abs(error_value) < 65535);
        }
        else
        {
            error_value = unmap_error_value(decode_value(k, traits_.limit, traits_.quantized_bits_per_pixel));
            if (UNLIKELY(std::abs(error_value) > 65535))
                impl::throw_jpegls_error(jpegls_errc::invalid_encoded_data);
        }
        if (k == 0)
        {
            error_value = error_value ^ context.get_error_correction(traits_.near_lossless);
        }
        context.update_variables_and_bias(error_value, traits_.near_lossless, traits_.reset_threshold);
        error_value = apply_sign(error_value, sign);
        return traits_.compute_reconstructed_sample(predicted_value, error_value);
    }